

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_pressure.cpp
# Opt level: O0

void __thiscall
spvtools::opt::RegisterLiveness::SimulateFission
          (RegisterLiveness *this,Loop *loop,
          unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
          *moved_inst,
          unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
          *copied_inst,RegionRegisterLiveness *l1_sim_result,RegionRegisterLiveness *l2_sim_result)

{
  uint32_t blk_id;
  anon_class_24_3_72e690ea predicate;
  FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:459:26)>
  __first;
  anon_class_24_3_72e690ea predicate_00;
  anon_class_24_3_72e690ea predicate_01;
  anon_class_24_3_72e690ea predicate_02;
  FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:455:26)>
  __first_00;
  FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:455:26)>
  __first_01;
  FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:455:26)>
  __first_02;
  FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:459:26)>
  __first_03;
  FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:455:26)>
  __first_04;
  FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:459:26)>
  __last;
  FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:459:26)>
  __last_00;
  FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:455:26)>
  __last_01;
  FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:455:26)>
  __last_02;
  FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:455:26)>
  __last_03;
  FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:455:26)>
  __last_04;
  bool bVar1;
  Op OVar2;
  BasicBlock *bb_00;
  reference puVar3;
  RegionRegisterLiveness *this_00;
  const_iterator __first_05;
  iterator __first_06;
  iterator __last_05;
  reference ppIVar4;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *this_01;
  reference pvVar5;
  CFG *this_02;
  unsigned_long *puVar6;
  size_type sVar7;
  anon_class_8_1_5b1a6210_for_predicate_ predicate_03;
  _Node_iterator_base<spvtools::opt::Instruction_*,_false> _Var8;
  Loop *in_stack_fffffffffffff968;
  Loop *local_650;
  Loop *local_648;
  anon_class_48_7_3c3d7ae9 local_640;
  function<void_(unsigned_int_*)> local_610;
  byte local_5ea;
  byte local_5e9;
  bool does_belong_to_loop2;
  Loop *pLStack_5e8;
  bool does_belong_to_loop1;
  Instruction *insn_2;
  reverse_iterator<spvtools::opt::InstructionList::iterator> __end3;
  reverse_iterator<spvtools::opt::InstructionList::iterator> __begin3;
  undefined1 local_5c8 [8];
  undefined1 local_5c0 [24];
  IteratorRange<std::reverse_iterator<spvtools::opt::InstructionList::iterator>_> *__range3;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  die_in_block;
  pointer local_568;
  pointer local_560;
  FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:459:26)>
  local_558;
  unsigned_long local_540;
  size_t l2_reg_count;
  _Node_const_iterator<spvtools::opt::Instruction_*,_true,_false> _Stack_530;
  unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
  *local_528;
  unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
  *puStack_520;
  Loop *local_518;
  FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:455:26)>
  local_510;
  unsigned_long local_4e8;
  size_t l1_reg_count;
  _Node_iterator_base<spvtools::opt::Instruction_*,_false> local_4d8;
  _Node_iterator_base<spvtools::opt::Instruction_*,_false> local_4d0;
  undefined1 local_4c8 [8];
  Range l2_block_live_out;
  _Node_iterator_base<spvtools::opt::Instruction_*,_false> local_480;
  _Node_iterator_base<spvtools::opt::Instruction_*,_false> local_478;
  undefined1 local_470 [8];
  Range l1_block_live_out;
  RegionRegisterLiveness *live_inout_1;
  BasicBlock *bb;
  _Node_iterator_base<unsigned_int,_false> _Stack_408;
  uint32_t bb_id_1;
  const_iterator __end2_3;
  const_iterator __begin2_3;
  BasicBlockListTy *__range2_3;
  Instruction *insn_1;
  iterator __end2_2;
  iterator __begin2_2;
  LiveSet *__range2_2;
  Instruction *insn;
  iterator __end2_1;
  iterator __begin2_1;
  LiveSet *__range2_1;
  FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:455:26)>
  local_3a0;
  FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:455:26)>
  local_378;
  unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
  *local_350;
  unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
  *local_348;
  Loop *local_340;
  _Node_iterator_base<spvtools::opt::Instruction_*,_false> local_338;
  _Node_iterator_base<spvtools::opt::Instruction_*,_false> local_330;
  undefined1 local_328 [8];
  Range live_out_1;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  Loop *local_2b8;
  FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:455:26)>
  local_2b0;
  unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
  *local_288;
  unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
  *local_280;
  Loop *local_278;
  _Node_iterator_base<spvtools::opt::Instruction_*,_false> local_270;
  _Node_iterator_base<spvtools::opt::Instruction_*,_false> local_268;
  undefined1 local_260 [8];
  Range live_out;
  RegionRegisterLiveness *live_inout;
  _Node_iterator_base<unsigned_int,_false> _Stack_1f0;
  uint32_t bb_id;
  iterator __end2;
  iterator __begin2;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *__range2;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  exit_blocks;
  undefined8 local_198;
  anon_class_8_1_5b1a6210_for_predicate_ local_190;
  FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:459:26)>
  local_188;
  RegionRegisterLiveness *local_170;
  _Node_iterator_base<spvtools::opt::Instruction_*,_false> local_168;
  _Node_iterator_base<spvtools::opt::Instruction_*,_false> local_160;
  undefined1 local_158 [8];
  Range live_loop_1;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  Loop *local_108;
  FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:455:26)>
  local_100;
  unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
  *local_d8;
  unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
  *local_d0;
  Loop *local_c8;
  _Node_iterator_base<spvtools::opt::Instruction_*,_false> local_c0;
  _Node_iterator_base<spvtools::opt::Instruction_*,_false> local_b8;
  undefined1 local_b0 [8];
  Range live_loop;
  RegionRegisterLiveness *header_live_inout;
  anon_class_8_1_5b1a6210_for_predicate_ belong_to_loop2;
  anon_class_24_3_72e690ea belong_to_loop1;
  RegionRegisterLiveness *l2_sim_result_local;
  RegionRegisterLiveness *l1_sim_result_local;
  unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
  *copied_inst_local;
  unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
  *moved_inst_local;
  Loop *loop_local;
  RegisterLiveness *this_local;
  
  predicate_03.moved_inst = &l1_sim_result->live_in_;
  RegionRegisterLiveness::Clear(l1_sim_result);
  RegionRegisterLiveness::Clear(l2_sim_result);
  header_live_inout = (RegionRegisterLiveness *)moved_inst;
  belong_to_loop2.moved_inst = moved_inst;
  bb_00 = Loop::GetHeaderBlock(loop);
  live_loop.end_.predicate_.loop = (Loop *)Get(this,bb_00);
  local_b8._M_cur =
       (__node_type *)
       std::
       unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
       ::begin((unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                *)live_loop.end_.predicate_.loop);
  local_c0._M_cur =
       (__node_type *)
       std::
       unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
       ::end((unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
              *)live_loop.end_.predicate_.loop);
  local_d8 = belong_to_loop2.moved_inst;
  predicate.copied_inst = copied_inst;
  predicate.moved_inst = belong_to_loop2.moved_inst;
  predicate.loop = loop;
  local_d0 = copied_inst;
  local_c8 = loop;
  MakeFilterIteratorRange<std::__detail::_Node_const_iterator<spvtools::opt::Instruction*,true,false>,spvtools::opt::RegisterLiveness::SimulateFission(spvtools::opt::Loop_const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*)const::__0>
            ((Range *)local_b0,(opt *)&local_b8,
             (_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false> *)&local_c0,
             (_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false> *)copied_inst,
             predicate);
  IteratorRange<spvtools::opt::FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp:455:26)>_>
  ::begin(&local_100,
          (IteratorRange<spvtools::opt::FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:455:26)>_>
           *)local_b0);
  IteratorRange<spvtools::opt::FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp:455:26)>_>
  ::end((FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:455:26)>
         *)&live_loop_1.end_.predicate_,
        (IteratorRange<spvtools::opt::FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:455:26)>_>
         *)local_b0);
  __first_00.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
       local_100.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
  __first_00.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
       local_100.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
  __first_00.predicate_.moved_inst = local_100.predicate_.moved_inst;
  __first_00.predicate_.copied_inst = local_100.predicate_.copied_inst;
  __first_00.predicate_.loop = local_100.predicate_.loop;
  __last_01.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
       (_Node_iterator_base<spvtools::opt::Instruction_*,_false>)
       (_Node_iterator_base<spvtools::opt::Instruction_*,_false>)uStack_120;
  __last_01.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
       (_Node_iterator_base<spvtools::opt::Instruction_*,_false>)
       (_Node_iterator_base<spvtools::opt::Instruction_*,_false>)
       live_loop_1.end_.predicate_.moved_inst;
  __last_01.predicate_.moved_inst =
       (unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
        *)local_118;
  __last_01.predicate_.copied_inst =
       (unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
        *)uStack_110;
  __last_01.predicate_.loop = local_108;
  std::
  unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>
  ::
  insert<spvtools::opt::FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction*,true,false>,spvtools::opt::RegisterLiveness::SimulateFission(spvtools::opt::Loop_const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*)const::__0>>
            ((unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>
              *)l1_sim_result,__first_00,__last_01);
  local_160._M_cur =
       (__node_type *)
       std::
       unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
       ::begin((unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                *)live_loop.end_.predicate_.loop);
  local_168._M_cur =
       (__node_type *)
       std::
       unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
       ::end((unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
              *)live_loop.end_.predicate_.loop);
  local_170 = header_live_inout;
  MakeFilterIteratorRange<std::__detail::_Node_const_iterator<spvtools::opt::Instruction*,true,false>,spvtools::opt::RegisterLiveness::SimulateFission(spvtools::opt::Loop_const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*)const::__1>
            ((Range *)local_158,(opt *)&local_160,
             (_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false> *)&local_168,
             (_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false> *)header_live_inout,
             predicate_03);
  IteratorRange<spvtools::opt::FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp:459:26)>_>
  ::begin(&local_188,
          (IteratorRange<spvtools::opt::FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:459:26)>_>
           *)local_158);
  IteratorRange<spvtools::opt::FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp:459:26)>_>
  ::end((FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:459:26)>
         *)&exit_blocks._M_h._M_single_bucket,
        (IteratorRange<spvtools::opt::FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:459:26)>_>
         *)local_158);
  __first.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
       local_188.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
  __first.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
       local_188.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
  __first.predicate_.moved_inst = local_188.predicate_.moved_inst;
  __last.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
       (_Node_iterator_base<spvtools::opt::Instruction_*,_false>)
       (_Node_iterator_base<spvtools::opt::Instruction_*,_false>)local_198;
  __last.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
       (_Node_iterator_base<spvtools::opt::Instruction_*,_false>)
       (_Node_iterator_base<spvtools::opt::Instruction_*,_false>)exit_blocks._M_h._M_single_bucket;
  __last.predicate_.moved_inst = local_190.moved_inst;
  std::
  unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>
  ::
  insert<spvtools::opt::FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction*,true,false>,spvtools::opt::RegisterLiveness::SimulateFission(spvtools::opt::Loop_const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*)const::__1>>
            ((unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>
              *)l2_sim_result,__first,__last);
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&__range2);
  Loop::GetExitBlocks(loop,(unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                            *)&__range2);
  __end2 = std::
           unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
           ::begin((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                    *)&__range2);
  _Stack_1f0._M_cur =
       (__node_type *)
       std::
       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
       ::end((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              *)&__range2);
  while (bVar1 = std::__detail::operator!=
                           (&__end2.super__Node_iterator_base<unsigned_int,_false>,
                            &stack0xfffffffffffffe10), bVar1) {
    puVar3 = std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator*(&__end2);
    this_00 = Get(this,*puVar3);
    __first_05 = std::
                 unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                 ::begin(&this_00->live_in_);
    live_out.end_.predicate_.loop =
         (Loop *)std::
                 unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                 ::end(&this_00->live_in_);
    std::
    unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>
    ::insert<std::__detail::_Node_const_iterator<spvtools::opt::Instruction*,true,false>>
              ((unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>
                *)&l2_sim_result->live_out_,
               (_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>)
               __first_05.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur,
               (_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>)
               live_out.end_.predicate_.loop);
    std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator++(&__end2);
  }
  local_268._M_cur =
       (__node_type *)
       std::
       unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
       ::begin(&l2_sim_result->live_out_);
  local_270._M_cur =
       (__node_type *)
       std::
       unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
       ::end(&l2_sim_result->live_out_);
  local_288 = belong_to_loop2.moved_inst;
  predicate_00.copied_inst = copied_inst;
  predicate_00.moved_inst = belong_to_loop2.moved_inst;
  predicate_00.loop = loop;
  local_280 = copied_inst;
  local_278 = loop;
  MakeFilterIteratorRange<std::__detail::_Node_iterator<spvtools::opt::Instruction*,true,false>,spvtools::opt::RegisterLiveness::SimulateFission(spvtools::opt::Loop_const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*)const::__0>
            ((Range *)local_260,(opt *)&local_268,
             (_Node_iterator<spvtools::opt::Instruction_*,_true,_false> *)&local_270,
             (_Node_iterator<spvtools::opt::Instruction_*,_true,_false> *)copied_inst,predicate_00);
  IteratorRange<spvtools::opt::FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp:455:26)>_>
  ::begin(&local_2b0,
          (IteratorRange<spvtools::opt::FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:455:26)>_>
           *)local_260);
  IteratorRange<spvtools::opt::FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp:455:26)>_>
  ::end((FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:455:26)>
         *)&live_out_1.end_.predicate_.loop,
        (IteratorRange<spvtools::opt::FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:455:26)>_>
         *)local_260);
  __first_01.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
       local_2b0.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
  __first_01.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
       local_2b0.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
  __first_01.predicate_.moved_inst = local_2b0.predicate_.moved_inst;
  __first_01.predicate_.copied_inst = local_2b0.predicate_.copied_inst;
  __first_01.predicate_.loop = local_2b0.predicate_.loop;
  __last_02.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
       (_Node_iterator_base<spvtools::opt::Instruction_*,_false>)
       (_Node_iterator_base<spvtools::opt::Instruction_*,_false>)uStack_2d0;
  __last_02.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
       (_Node_iterator_base<spvtools::opt::Instruction_*,_false>)
       (_Node_iterator_base<spvtools::opt::Instruction_*,_false>)live_out_1.end_.predicate_.loop;
  __last_02.predicate_.moved_inst =
       (unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
        *)local_2c8;
  __last_02.predicate_.copied_inst =
       (unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
        *)uStack_2c0;
  __last_02.predicate_.loop = local_2b8;
  std::
  unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>
  ::
  insert<spvtools::opt::FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction*,true,false>,spvtools::opt::RegisterLiveness::SimulateFission(spvtools::opt::Loop_const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*)const::__0>>
            ((unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>
              *)&l1_sim_result->live_out_,__first_01,__last_02);
  local_330._M_cur =
       (__node_type *)
       std::
       unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
       ::begin(&l2_sim_result->live_in_);
  local_338._M_cur =
       (__node_type *)
       std::
       unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
       ::end(&l2_sim_result->live_in_);
  local_350 = belong_to_loop2.moved_inst;
  predicate_01.copied_inst = copied_inst;
  predicate_01.moved_inst = belong_to_loop2.moved_inst;
  predicate_01.loop = loop;
  local_348 = copied_inst;
  local_340 = loop;
  MakeFilterIteratorRange<std::__detail::_Node_iterator<spvtools::opt::Instruction*,true,false>,spvtools::opt::RegisterLiveness::SimulateFission(spvtools::opt::Loop_const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*)const::__0>
            ((Range *)local_328,(opt *)&local_330,
             (_Node_iterator<spvtools::opt::Instruction_*,_true,_false> *)&local_338,
             (_Node_iterator<spvtools::opt::Instruction_*,_true,_false> *)copied_inst,predicate_01);
  IteratorRange<spvtools::opt::FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp:455:26)>_>
  ::begin(&local_378,
          (IteratorRange<spvtools::opt::FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:455:26)>_>
           *)local_328);
  IteratorRange<spvtools::opt::FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp:455:26)>_>
  ::end(&local_3a0,
        (IteratorRange<spvtools::opt::FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:455:26)>_>
         *)local_328);
  __first_02.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
       local_378.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
  __first_02.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
       local_378.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
  __first_02.predicate_.moved_inst = local_378.predicate_.moved_inst;
  __first_02.predicate_.copied_inst = local_378.predicate_.copied_inst;
  __first_02.predicate_.loop = local_378.predicate_.loop;
  __last_03.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
       local_3a0.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
  __last_03.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
       local_3a0.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
  __last_03.predicate_.moved_inst = local_3a0.predicate_.moved_inst;
  __last_03.predicate_.copied_inst = local_3a0.predicate_.copied_inst;
  __last_03.predicate_.loop = local_3a0.predicate_.loop;
  std::
  unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>
  ::
  insert<spvtools::opt::FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction*,true,false>,spvtools::opt::RegisterLiveness::SimulateFission(spvtools::opt::Loop_const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*)const::__0>>
            ((unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>
              *)&l1_sim_result->live_out_,__first_02,__last_03);
  __first_06 = std::
               unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
               ::begin(&l1_sim_result->live_out_);
  __last_05 = std::
              unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
              ::end(&l1_sim_result->live_out_);
  std::
  unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>
  ::insert<std::__detail::_Node_iterator<spvtools::opt::Instruction*,true,false>>
            ((unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>
              *)l2_sim_result,
             (_Node_iterator<spvtools::opt::Instruction_*,_true,_false>)
             __first_06.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur,
             (_Node_iterator<spvtools::opt::Instruction_*,_true,_false>)
             __last_05.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur);
  __end2_1 = std::
             unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
             ::begin(&l1_sim_result->live_in_);
  insn = (Instruction *)
         std::
         unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
         ::end(&l1_sim_result->live_in_);
  while (bVar1 = std::__detail::operator!=
                           (&__end2_1.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>
                            ,(_Node_iterator_base<spvtools::opt::Instruction_*,_false> *)&insn),
        bVar1) {
    ppIVar4 = std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>::operator*
                        (&__end2_1);
    RegionRegisterLiveness::AddRegisterClass(l1_sim_result,*ppIVar4);
    std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>::operator++(&__end2_1);
  }
  __end2_2 = std::
             unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
             ::begin(&l2_sim_result->live_in_);
  insn_1 = (Instruction *)
           std::
           unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
           ::end(&l2_sim_result->live_in_);
  while (bVar1 = std::__detail::operator!=
                           (&__end2_2.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>
                            ,(_Node_iterator_base<spvtools::opt::Instruction_*,_false> *)&insn_1),
        bVar1) {
    ppIVar4 = std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>::operator*
                        (&__end2_2);
    RegionRegisterLiveness::AddRegisterClass(l2_sim_result,*ppIVar4);
    std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>::operator++(&__end2_2);
  }
  l1_sim_result->used_registers_ = 0;
  l2_sim_result->used_registers_ = 0;
  this_01 = (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
             *)Loop::GetBlocks(loop);
  __end2_3 = std::
             unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
             ::begin(this_01);
  _Stack_408._M_cur =
       (__node_type *)
       std::
       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
       ::end(this_01);
  do {
    bVar1 = std::__detail::operator!=
                      (&__end2_3.super__Node_iterator_base<unsigned_int,_false>,
                       &stack0xfffffffffffffbf8);
    if (!bVar1) {
      std::
      unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                        *)&__range2);
      return;
    }
    pvVar5 = std::__detail::_Node_const_iterator<unsigned_int,_true,_false>::operator*(&__end2_3);
    blk_id = *pvVar5;
    this_02 = IRContext::cfg(this->context_);
    CFG::block(this_02,blk_id);
    l1_block_live_out.end_.predicate_.loop = (Loop *)Get(this,blk_id);
    if (l1_block_live_out.end_.predicate_.loop == (Loop *)0x0) {
      __assert_fail("live_inout != nullptr && \"Basic block not processed\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp"
                    ,0x207,
                    "void spvtools::opt::RegisterLiveness::SimulateFission(const Loop &, const std::unordered_set<Instruction *> &, const std::unordered_set<Instruction *> &, RegionRegisterLiveness *, RegionRegisterLiveness *) const"
                   );
    }
    local_478._M_cur =
         (__node_type *)
         std::
         unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
         ::begin((LiveSet *)&(l1_block_live_out.end_.predicate_.loop)->nested_loops_);
    local_480._M_cur =
         (__node_type *)
         std::
         unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
         ::end((unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                *)&(l1_block_live_out.end_.predicate_.loop)->nested_loops_);
    l2_block_live_out.end_.predicate_ = belong_to_loop2;
    predicate_02.copied_inst = copied_inst;
    predicate_02.moved_inst = belong_to_loop2.moved_inst;
    predicate_02.loop = loop;
    MakeFilterIteratorRange<std::__detail::_Node_const_iterator<spvtools::opt::Instruction*,true,false>,spvtools::opt::RegisterLiveness::SimulateFission(spvtools::opt::Loop_const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*)const::__0>
              ((Range *)local_470,(opt *)&local_478,
               (_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false> *)&local_480,
               (_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false> *)copied_inst,
               predicate_02);
    local_4d0._M_cur =
         (__node_type *)
         std::
         unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
         ::begin((unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                  *)&(l1_block_live_out.end_.predicate_.loop)->nested_loops_);
    local_4d8._M_cur =
         (__node_type *)
         std::
         unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
         ::end((unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                *)&(l1_block_live_out.end_.predicate_.loop)->nested_loops_);
    l1_reg_count = (size_t)header_live_inout;
    MakeFilterIteratorRange<std::__detail::_Node_const_iterator<spvtools::opt::Instruction*,true,false>,spvtools::opt::RegisterLiveness::SimulateFission(spvtools::opt::Loop_const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*)const::__1>
              ((Range *)local_4c8,(opt *)&local_4d0,
               (_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false> *)&local_4d8,
               (_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false> *)header_live_inout,
               predicate_03);
    IteratorRange<spvtools::opt::FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp:455:26)>_>
    ::begin(&local_510,
            (IteratorRange<spvtools::opt::FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:455:26)>_>
             *)local_470);
    IteratorRange<spvtools::opt::FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp:455:26)>_>
    ::end((FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:455:26)>
           *)&l2_reg_count,
          (IteratorRange<spvtools::opt::FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:455:26)>_>
           *)local_470);
    __first_04.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
         (_Node_iterator_base<spvtools::opt::Instruction_*,_false>)
         (_Node_iterator_base<spvtools::opt::Instruction_*,_false>)local_510.predicate_.moved_inst;
    __first_04.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
         local_510.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
    __first_04.predicate_.moved_inst = local_510.predicate_.copied_inst;
    __first_04.predicate_.copied_inst =
         (unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
          *)local_510.predicate_.loop;
    __first_04.predicate_.loop = (Loop *)l2_reg_count;
    __last_04.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
         (_Node_iterator_base<spvtools::opt::Instruction_*,_false>)
         (_Node_iterator_base<spvtools::opt::Instruction_*,_false>)local_528;
    __last_04.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
         _Stack_530.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
    __last_04.predicate_.moved_inst = puStack_520;
    __last_04.predicate_.copied_inst =
         (unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
          *)local_518;
    __last_04.predicate_.loop = in_stack_fffffffffffff968;
    _Var8 = _Stack_530.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
    local_4e8 = std::
                distance<spvtools::opt::FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction*,true,false>,spvtools::opt::RegisterLiveness::SimulateFission(spvtools::opt::Loop_const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*)const::__0>>
                          (__first_04,__last_04);
    IteratorRange<spvtools::opt::FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp:459:26)>_>
    ::begin(&local_558,
            (IteratorRange<spvtools::opt::FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:459:26)>_>
             *)local_4c8);
    IteratorRange<spvtools::opt::FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp:459:26)>_>
    ::end((FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:459:26)>
           *)&die_in_block._M_h._M_single_bucket,
          (IteratorRange<spvtools::opt::FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:459:26)>_>
           *)local_4c8);
    __first_03.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
         (_Node_iterator_base<spvtools::opt::Instruction_*,_false>)
         (_Node_iterator_base<spvtools::opt::Instruction_*,_false>)local_558.predicate_.moved_inst;
    __first_03.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
         local_558.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
    __first_03.predicate_.moved_inst =
         (unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
          *)die_in_block._M_h._M_single_bucket;
    __last_00.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
         (_Node_iterator_base<spvtools::opt::Instruction_*,_false>)
         (_Node_iterator_base<spvtools::opt::Instruction_*,_false>)local_560;
    __last_00.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
         (_Node_iterator_base<spvtools::opt::Instruction_*,_false>)
         (_Node_iterator_base<spvtools::opt::Instruction_*,_false>)local_568;
    __last_00.predicate_.moved_inst =
         (unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
          *)_Var8._M_cur;
    local_540 = std::
                distance<spvtools::opt::FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction*,true,false>,spvtools::opt::RegisterLiveness::SimulateFission(spvtools::opt::Loop_const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*)const::__1>>
                          (__first_03,__last_00);
    std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)&__range3);
    BasicBlock::rbegin((BasicBlock *)local_5c8);
    BasicBlock::rend((BasicBlock *)&__begin3);
    make_range<std::reverse_iterator<spvtools::opt::InstructionList::iterator>>
              ((opt *)local_5c0,
               (reverse_iterator<spvtools::opt::InstructionList::iterator> *)local_5c8,&__begin3);
    local_5c0._16_8_ = local_5c0;
    IteratorRange<std::reverse_iterator<spvtools::opt::InstructionList::iterator>_>::begin
              ((IteratorRange<std::reverse_iterator<spvtools::opt::InstructionList::iterator>_> *)
               &__end3);
    IteratorRange<std::reverse_iterator<spvtools::opt::InstructionList::iterator>_>::end
              ((IteratorRange<std::reverse_iterator<spvtools::opt::InstructionList::iterator>_> *)
               &insn_2);
    while (bVar1 = std::operator!=(&__end3,(reverse_iterator<spvtools::opt::InstructionList::iterator>
                                            *)&insn_2), bVar1) {
      pLStack_5e8 = (Loop *)std::reverse_iterator<spvtools::opt::InstructionList::iterator>::
                            operator*(&__end3);
      OVar2 = opt::Instruction::opcode((Instruction *)pLStack_5e8);
      if (OVar2 == OpPhi) break;
      local_5e9 = SimulateFission::anon_class_24_3_72e690ea::operator()
                            ((anon_class_24_3_72e690ea *)&belong_to_loop2,(Instruction *)pLStack_5e8
                            );
      local_640.does_belong_to_loop2 =
           FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp:459:26)>
           ::anon_class_8_1_5b1a6210_for_predicate_::operator()
                     ((anon_class_8_1_5b1a6210_for_predicate_ *)&header_live_inout,
                      (Instruction *)pLStack_5e8);
      local_640.live_inout = (RegionRegisterLiveness *)l1_block_live_out.end_.predicate_.loop;
      local_640.die_in_block =
           (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            *)&__range3;
      local_640.l1_reg_count = &local_4e8;
      local_640.l2_reg_count = &local_540;
      local_640.does_belong_to_loop1 = (bool)(local_5e9 & 1);
      in_stack_fffffffffffff968 = pLStack_5e8;
      local_640.this = this;
      local_5ea = local_640.does_belong_to_loop2;
      std::function<void(unsigned_int*)>::
      function<spvtools::opt::RegisterLiveness::SimulateFission(spvtools::opt::Loop_const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*)const::__2,void>
                ((function<void(unsigned_int*)> *)&local_610,&local_640);
      opt::Instruction::ForEachInId((Instruction *)in_stack_fffffffffffff968,&local_610);
      std::function<void_(unsigned_int_*)>::~function(&local_610);
      puVar6 = std::max<unsigned_long>(&l1_sim_result->used_registers_,&local_4e8);
      l1_sim_result->used_registers_ = *puVar6;
      puVar6 = std::max<unsigned_long>(&l2_sim_result->used_registers_,&local_540);
      l2_sim_result->used_registers_ = *puVar6;
      bVar1 = anon_unknown_8::CreatesRegisterUsage((Instruction *)pLStack_5e8);
      if (bVar1) {
        if ((local_5e9 & 1) != 0) {
          local_648 = pLStack_5e8;
          sVar7 = std::
                  unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                  ::count(&l1_sim_result->live_in_,(key_type *)&local_648);
          if (sVar7 == 0) {
            RegionRegisterLiveness::AddRegisterClass(l1_sim_result,(Instruction *)pLStack_5e8);
          }
          local_4e8 = local_4e8 - 1;
        }
        if ((local_5ea & 1) != 0) {
          local_650 = pLStack_5e8;
          sVar7 = std::
                  unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                  ::count(&l2_sim_result->live_in_,(key_type *)&local_650);
          if (sVar7 == 0) {
            RegionRegisterLiveness::AddRegisterClass(l2_sim_result,(Instruction *)pLStack_5e8);
          }
          local_540 = local_540 - 1;
        }
      }
      std::reverse_iterator<spvtools::opt::InstructionList::iterator>::operator++(&__end3);
    }
    std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                      *)&__range3);
    std::__detail::_Node_const_iterator<unsigned_int,_true,_false>::operator++(&__end2_3);
  } while( true );
}

Assistant:

void RegisterLiveness::SimulateFission(
    const Loop& loop, const std::unordered_set<Instruction*>& moved_inst,
    const std::unordered_set<Instruction*>& copied_inst,
    RegionRegisterLiveness* l1_sim_result,
    RegionRegisterLiveness* l2_sim_result) const {
  l1_sim_result->Clear();
  l2_sim_result->Clear();

  // Filter predicates: consider instructions that only belong to the first and
  // second loop.
  auto belong_to_loop1 = [&moved_inst, &copied_inst, &loop](Instruction* insn) {
    return moved_inst.count(insn) || copied_inst.count(insn) ||
           !loop.IsInsideLoop(insn);
  };
  auto belong_to_loop2 = [&moved_inst](Instruction* insn) {
    return !moved_inst.count(insn);
  };

  const RegionRegisterLiveness* header_live_inout = Get(loop.GetHeaderBlock());
  // l1 live-in
  {
    auto live_loop = MakeFilterIteratorRange(
        header_live_inout->live_in_.begin(), header_live_inout->live_in_.end(),
        belong_to_loop1);
    l1_sim_result->live_in_.insert(live_loop.begin(), live_loop.end());
  }
  // l2 live-in
  {
    auto live_loop = MakeFilterIteratorRange(
        header_live_inout->live_in_.begin(), header_live_inout->live_in_.end(),
        belong_to_loop2);
    l2_sim_result->live_in_.insert(live_loop.begin(), live_loop.end());
  }

  std::unordered_set<uint32_t> exit_blocks;
  loop.GetExitBlocks(&exit_blocks);

  // l2 live-out.
  for (uint32_t bb_id : exit_blocks) {
    const RegionRegisterLiveness* live_inout = Get(bb_id);
    l2_sim_result->live_out_.insert(live_inout->live_in_.begin(),
                                    live_inout->live_in_.end());
  }
  // l1 live-out.
  {
    auto live_out = MakeFilterIteratorRange(l2_sim_result->live_out_.begin(),
                                            l2_sim_result->live_out_.end(),
                                            belong_to_loop1);
    l1_sim_result->live_out_.insert(live_out.begin(), live_out.end());
  }
  {
    auto live_out =
        MakeFilterIteratorRange(l2_sim_result->live_in_.begin(),
                                l2_sim_result->live_in_.end(), belong_to_loop1);
    l1_sim_result->live_out_.insert(live_out.begin(), live_out.end());
  }
  // Lives out of l1 are live out of l2 so are live in of l2 as well.
  l2_sim_result->live_in_.insert(l1_sim_result->live_out_.begin(),
                                 l1_sim_result->live_out_.end());

  for (Instruction* insn : l1_sim_result->live_in_) {
    l1_sim_result->AddRegisterClass(insn);
  }
  for (Instruction* insn : l2_sim_result->live_in_) {
    l2_sim_result->AddRegisterClass(insn);
  }

  l1_sim_result->used_registers_ = 0;
  l2_sim_result->used_registers_ = 0;

  for (uint32_t bb_id : loop.GetBlocks()) {
    BasicBlock* bb = context_->cfg()->block(bb_id);

    const RegisterLiveness::RegionRegisterLiveness* live_inout = Get(bb_id);
    assert(live_inout != nullptr && "Basic block not processed");
    auto l1_block_live_out =
        MakeFilterIteratorRange(live_inout->live_out_.begin(),
                                live_inout->live_out_.end(), belong_to_loop1);
    auto l2_block_live_out =
        MakeFilterIteratorRange(live_inout->live_out_.begin(),
                                live_inout->live_out_.end(), belong_to_loop2);

    size_t l1_reg_count =
        std::distance(l1_block_live_out.begin(), l1_block_live_out.end());
    size_t l2_reg_count =
        std::distance(l2_block_live_out.begin(), l2_block_live_out.end());

    std::unordered_set<uint32_t> die_in_block;
    for (Instruction& insn : make_range(bb->rbegin(), bb->rend())) {
      if (insn.opcode() == spv::Op::OpPhi) {
        break;
      }

      bool does_belong_to_loop1 = belong_to_loop1(&insn);
      bool does_belong_to_loop2 = belong_to_loop2(&insn);
      insn.ForEachInId([live_inout, &die_in_block, &l1_reg_count, &l2_reg_count,
                        does_belong_to_loop1, does_belong_to_loop2,
                        this](uint32_t* id) {
        Instruction* op_insn = context_->get_def_use_mgr()->GetDef(*id);
        if (!CreatesRegisterUsage(op_insn) ||
            live_inout->live_out_.count(op_insn)) {
          // already taken into account.
          return;
        }
        if (!die_in_block.count(*id)) {
          if (does_belong_to_loop1) {
            l1_reg_count++;
          }
          if (does_belong_to_loop2) {
            l2_reg_count++;
          }
          die_in_block.insert(*id);
        }
      });
      l1_sim_result->used_registers_ =
          std::max(l1_sim_result->used_registers_, l1_reg_count);
      l2_sim_result->used_registers_ =
          std::max(l2_sim_result->used_registers_, l2_reg_count);
      if (CreatesRegisterUsage(&insn)) {
        if (does_belong_to_loop1) {
          if (!l1_sim_result->live_in_.count(&insn)) {
            l1_sim_result->AddRegisterClass(&insn);
          }
          l1_reg_count--;
        }
        if (does_belong_to_loop2) {
          if (!l2_sim_result->live_in_.count(&insn)) {
            l2_sim_result->AddRegisterClass(&insn);
          }
          l2_reg_count--;
        }
      }
    }
  }
}